

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  char *__dest;
  VM *vm;
  size_t sVar2;
  anon_union_8_2_14f5a2bf_for_Value_1 aVar3;
  Value moduleName;
  
  if (argc != 1) {
    __s = argv[1];
    pcVar1 = strrchr(__s,0x2f);
    if (pcVar1 != (char *)0x0) {
      __dest = (char *)malloc((size_t)(pcVar1 + (2 - (long)__s)));
      memcpy(__dest,__s,(size_t)(pcVar1 + (1 - (long)__s)));
      __dest[(long)(pcVar1 + (1 - (long)__s))] = '\0';
      rootDir = __dest;
    }
    vm = newVM();
    pcVar1 = readFile(__s);
    sVar2 = strlen(__s);
    aVar3.objHeader = &newObjString(vm,__s,(uint32_t)sVar2)->objHeader;
    moduleName.field_1.objHeader = aVar3.objHeader;
    moduleName._0_8_ = 5;
    executeModule(vm,moduleName,pcVar1);
  }
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
    if (argc == 1) {

    } else {
        runFile(argv[1]);
    }
    return 0;
}